

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

bool __thiscall
ChainstateManager::ProcessNewBlock
          (ChainstateManager *this,shared_ptr<const_CBlock> *block,bool force_processing,
          bool min_pow_checked,bool *new_block)

{
  ValidationSignals *this_00;
  _Head_base<0UL,_Chainstate_*,_false> _Var1;
  bool bVar2;
  Chainstate *pCVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Head_base<0UL,_Chainstate_*,_false> this_01;
  long in_FS_OFFSET;
  string_view source_file;
  shared_ptr<const_CBlock> pblock;
  string_view source_file_00;
  shared_ptr<const_CBlock> pblock_00;
  string_view source_file_01;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  CBlockIndex *pindex;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock35;
  BlockValidationState bg_state;
  BlockValidationState state;
  uint in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  char (*in_stack_fffffffffffffee8) [16];
  element_type *in_stack_fffffffffffffef0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_108;
  element_type *local_100;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f8;
  CBlockIndex *local_f0;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  _Alloc_hider local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  ValidationState<BlockValidationResult> local_80;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_f0 = (CBlockIndex *)0x0;
  if (new_block != (bool *)0x0) {
    *new_block = false;
  }
  local_80.m_reject_reason._M_dataplus._M_p = (pointer)&local_80.m_reject_reason.field_2;
  local_80.m_mode = M_VALID;
  local_80.m_result = BLOCK_RESULT_UNSET;
  local_80.m_reject_reason._M_string_length = 0;
  local_80.m_reject_reason.field_2._M_local_buf[0] = '\0';
  local_80.m_debug_message._M_dataplus._M_p = (pointer)&local_80.m_debug_message.field_2;
  local_80.m_debug_message._M_string_length = 0;
  local_80.m_debug_message.field_2._M_local_buf[0] = '\0';
  local_e8._0_8_ = &cs_main;
  local_e8[8] = false;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_e8);
  bVar2 = CheckBlock((block->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                     (BlockValidationState *)&local_80,&((this->m_options).chainparams)->consensus,
                     true,true);
  if (bVar2) {
    in_stack_fffffffffffffee0 = (uint)min_pow_checked;
    bVar2 = AcceptBlock(this,block,(BlockValidationState *)&local_80,&local_f0,force_processing,
                        (FlatFilePos *)0x0,new_block,min_pow_checked);
  }
  if (bVar2 == false) {
    this_00 = (this->m_options).signals;
    if (this_00 != (ValidationSignals *)0x0) {
      ValidationSignals::BlockChecked
                (this_00,(block->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr,(BlockValidationState *)&local_80);
    }
    ValidationState<BlockValidationResult>::ToString_abi_cxx11_((string *)local_c8,&local_80);
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp";
    source_file._M_len = 0x57;
    logging_function._M_str = "ProcessNewBlock";
    logging_function._M_len = 0xf;
    LogPrintf_<char[16],std::__cxx11::string>
              (logging_function,source_file,0x11dc,
               IPC|I2P|VALIDATION|LEVELDB|QT|COINDB|LIBEVENT|MEMPOOLREJ|PROXY|PRUNE|RAND|CMPCTBLOCK|
               REINDEX|SELECTCOINS|RPC|ZMQ|BENCH|HTTP|TOR|NET,(Level)(string *)local_c8,
               (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               in_stack_fffffffffffffee8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffef0);
    if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
      operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_debug_message._M_dataplus._M_p != &local_80.m_debug_message.field_2) {
    operator_delete(local_80.m_debug_message._M_dataplus._M_p,
                    CONCAT71(local_80.m_debug_message.field_2._M_allocated_capacity._1_7_,
                             local_80.m_debug_message.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_reject_reason._M_dataplus._M_p != &local_80.m_reject_reason.field_2) {
    operator_delete(local_80.m_reject_reason._M_dataplus._M_p,
                    CONCAT71(local_80.m_reject_reason.field_2._M_allocated_capacity._1_7_,
                             local_80.m_reject_reason.field_2._M_local_buf[0]) + 1);
  }
  if (bVar2 == false) {
    bVar2 = false;
  }
  else {
    NotifyHeaderTip(this);
    local_80.m_mode = M_VALID;
    local_80.m_result = BLOCK_RESULT_UNSET;
    local_80.m_reject_reason._M_dataplus._M_p = (pointer)&local_80.m_reject_reason.field_2;
    local_80.m_reject_reason._M_string_length = 0;
    local_80.m_reject_reason.field_2._M_local_buf[0] = '\0';
    local_80.m_debug_message._M_dataplus._M_p = (pointer)&local_80.m_debug_message.field_2;
    local_80.m_debug_message._M_string_length = 0;
    local_80.m_debug_message.field_2._M_local_buf[0] = '\0';
    pCVar3 = ActiveChainstate(this);
    local_100 = (block->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    _Var4._M_pi = (block->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                  _M_pi;
    if (_Var4._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (_Var4._M_pi)->_M_use_count = (_Var4._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (_Var4._M_pi)->_M_use_count = (_Var4._M_pi)->_M_use_count + 1;
      }
    }
    pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var4._M_pi;
    pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&local_100;
    local_f8 = _Var4._M_pi;
    bVar2 = Chainstate::ActivateBestChain(pCVar3,(BlockValidationState *)&local_80,pblock);
    if (local_f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8);
    }
    if (bVar2) {
      local_c8._0_8_ = &cs_main;
      local_c8._8_8_ = local_c8._8_8_ & 0xffffffffffffff00;
      std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_c8);
      pCVar3 = (this->m_snapshot_chainstate)._M_t.
               super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
               super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
               super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
      if (((pCVar3 == (Chainstate *)0x0) || (pCVar3->m_disabled != false)) ||
         (_Var1._M_head_impl =
               (this->m_ibd_chainstate)._M_t.
               super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
               super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
               super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl,
         _Var1._M_head_impl == (Chainstate *)0x0)) {
        this_01._M_head_impl = (Chainstate *)0x0;
      }
      else {
        this_01._M_head_impl = (Chainstate *)0x0;
        if ((_Var1._M_head_impl)->m_disabled == false) {
          this_01._M_head_impl = _Var1._M_head_impl;
        }
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock
                ((unique_lock<std::recursive_mutex> *)local_c8);
      bVar2 = false;
      local_c8._0_8_ = (pointer)0x0;
      local_c8._16_8_ = 0;
      local_b0._M_local_buf[0] = '\0';
      local_98 = 0;
      local_90._M_local_buf[0] = '\0';
      local_c8._8_8_ = &local_b0;
      local_a0._M_p = (pointer)&local_90;
      if (this_01._M_head_impl != (Chainstate *)0x0) {
        in_stack_fffffffffffffef0 =
             (block->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_108 = (block->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount._M_pi;
        if (local_108 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          _Var4._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_108->_M_use_count = local_108->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_108->_M_use_count = local_108->_M_use_count + 1;
          }
        }
        pblock_00.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             _Var4._M_pi;
        pblock_00.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&stack0xfffffffffffffef0;
        bVar2 = Chainstate::ActivateBestChain
                          (this_01._M_head_impl,(BlockValidationState *)local_c8,pblock_00);
        bVar2 = !bVar2;
      }
      if ((this_01._M_head_impl != (Chainstate *)0x0) &&
         (local_108 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_108);
      }
      if (bVar2 != false) {
        ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                  ((string *)local_e8,(ValidationState<BlockValidationResult> *)local_c8);
        source_file_01._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
        ;
        source_file_01._M_len = 0x57;
        logging_function_01._M_str = "ProcessNewBlock";
        logging_function_01._M_len = 0xf;
        LogPrintf_<char[16],std::__cxx11::string>
                  (logging_function_01,source_file_01,0x11ec,
                   IPC|I2P|VALIDATION|LEVELDB|QT|COINDB|LIBEVENT|MEMPOOLREJ|PROXY|PRUNE|RAND|
                   CMPCTBLOCK|REINDEX|SELECTCOINS|RPC|WALLETDB|ZMQ|BENCH|HTTP|TOR|NET,
                   (Level)(string *)local_e8,
                   (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                   in_stack_fffffffffffffee8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffef0);
        if ((mutex_type *)local_e8._0_8_ != (mutex_type *)local_d8) {
          operator_delete((void *)local_e8._0_8_,local_d8._0_8_ + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_p != &local_90) {
        operator_delete(local_a0._M_p,
                        CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0]) + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._8_8_ != &local_b0) {
        operator_delete((void *)local_c8._8_8_,CONCAT71(local_b0._1_7_,local_b0._M_local_buf[0]) + 1
                       );
      }
      bVar2 = (bool)(bVar2 ^ 1);
    }
    else {
      ValidationState<BlockValidationResult>::ToString_abi_cxx11_((string *)local_c8,&local_80);
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
      ;
      source_file_00._M_len = 0x57;
      logging_function_00._M_str = "ProcessNewBlock";
      logging_function_00._M_len = 0xf;
      LogPrintf_<char[16],std::__cxx11::string>
                (logging_function_00,source_file_00,0x11e5,
                 IPC|I2P|VALIDATION|LEVELDB|QT|COINDB|LIBEVENT|MEMPOOLREJ|PROXY|PRUNE|RAND|
                 CMPCTBLOCK|REINDEX|SELECTCOINS|RPC|WALLETDB|BENCH|HTTP,(Level)(string *)local_c8,
                 (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 in_stack_fffffffffffffee8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffef0);
      if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
        operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
      }
      bVar2 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80.m_debug_message._M_dataplus._M_p != &local_80.m_debug_message.field_2) {
      operator_delete(local_80.m_debug_message._M_dataplus._M_p,
                      CONCAT71(local_80.m_debug_message.field_2._M_allocated_capacity._1_7_,
                               local_80.m_debug_message.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80.m_reject_reason._M_dataplus._M_p != &local_80.m_reject_reason.field_2) {
      operator_delete(local_80.m_reject_reason._M_dataplus._M_p,
                      CONCAT71(local_80.m_reject_reason.field_2._M_allocated_capacity._1_7_,
                               local_80.m_reject_reason.field_2._M_local_buf[0]) + 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool ChainstateManager::ProcessNewBlock(const std::shared_ptr<const CBlock>& block, bool force_processing, bool min_pow_checked, bool* new_block)
{
    AssertLockNotHeld(cs_main);

    {
        CBlockIndex *pindex = nullptr;
        if (new_block) *new_block = false;
        BlockValidationState state;

        // CheckBlock() does not support multi-threaded block validation because CBlock::fChecked can cause data race.
        // Therefore, the following critical section must include the CheckBlock() call as well.
        LOCK(cs_main);

        // Skipping AcceptBlock() for CheckBlock() failures means that we will never mark a block as invalid if
        // CheckBlock() fails.  This is protective against consensus failure if there are any unknown forms of block
        // malleability that cause CheckBlock() to fail; see e.g. CVE-2012-2459 and
        // https://lists.linuxfoundation.org/pipermail/bitcoin-dev/2019-February/016697.html.  Because CheckBlock() is
        // not very expensive, the anti-DoS benefits of caching failure (of a definitely-invalid block) are not substantial.
        bool ret = CheckBlock(*block, state, GetConsensus());
        if (ret) {
            // Store to disk
            ret = AcceptBlock(block, state, &pindex, force_processing, nullptr, new_block, min_pow_checked);
        }
        if (!ret) {
            if (m_options.signals) {
                m_options.signals->BlockChecked(*block, state);
            }
            LogError("%s: AcceptBlock FAILED (%s)\n", __func__, state.ToString());
            return false;
        }
    }

    NotifyHeaderTip();

    BlockValidationState state; // Only used to report errors, not invalidity - ignore it
    if (!ActiveChainstate().ActivateBestChain(state, block)) {
        LogError("%s: ActivateBestChain failed (%s)\n", __func__, state.ToString());
        return false;
    }

    Chainstate* bg_chain{WITH_LOCK(cs_main, return BackgroundSyncInProgress() ? m_ibd_chainstate.get() : nullptr)};
    BlockValidationState bg_state;
    if (bg_chain && !bg_chain->ActivateBestChain(bg_state, block)) {
        LogError("%s: [background] ActivateBestChain failed (%s)\n", __func__, bg_state.ToString());
        return false;
     }

    return true;
}